

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

void Assimp::IFC::CleanupOuterContour
               (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *contour_flat,
               TempMesh *curmesh)

{
  pointer paVar1;
  pointer pIVar2;
  pointer puVar3;
  double dVar4;
  double dVar5;
  pointer paVar6;
  pointer paVar7;
  pointer puVar8;
  pointer puVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  IfcVector2 *pip;
  pointer paVar14;
  pointer pIVar15;
  ExPolygon *ex;
  pointer pEVar16;
  pointer paVar17;
  undefined1 auVar18 [16];
  Polygon subject;
  undefined1 local_268 [16];
  double local_258;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  Polygon clip;
  ExPolygons clipped;
  long local_1e0;
  _Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_1d8;
  pointer local_1b8;
  pointer local_1b0;
  Clipper clipper;
  
  local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&local_1d8,
             ((long)(curmesh->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(curmesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
             (long)(curmesh->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(curmesh->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  subject.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  subject.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  subject.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ClipperLib::Clipper::Clipper(&clipper);
  clipped.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  clipped.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  clipped.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
            (&clip,(long)(contour_flat->
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(contour_flat->
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4);
  paVar1 = (contour_flat->
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (paVar14 = (contour_flat->
                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_start; paVar14 != paVar1; paVar14 = paVar14 + 1)
  {
    dVar4 = paVar14->x * 1518500249.0;
    uVar11 = (ulong)dVar4;
    dVar5 = paVar14->y * 1518500249.0;
    uVar12 = (ulong)dVar5;
    local_268._8_8_ = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12;
    local_268._0_8_ = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    emplace_back<ClipperLib::IntPoint>(&clip,(IntPoint *)local_268);
  }
  bVar10 = ClipperLib::Orientation(&clip);
  if (!bVar10) {
    std::
    __reverse<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
              (clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start,
               clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve(&subject,4);
  paVar17 = (curmesh->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1b8 = (curmesh->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_finish;
  uVar11 = 0;
  local_1e0 = 0;
  do {
    if (paVar17 == local_1b8) {
      std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
                (&clip.
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>);
      std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector(&clipped);
      ClipperLib::Clipper::~Clipper(&clipper);
      std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
                (&subject.
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>);
      paVar6 = (curmesh->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar7 = (curmesh->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      paVar17 = (curmesh->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_1d8._M_impl.super__Vector_impl_data._M_start
      ;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_1d8._M_impl.super__Vector_impl_data._M_finish;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar3 = (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar8 = (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar9 = (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = local_248._M_impl.super__Vector_impl_data._M_start;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = local_248._M_impl.super__Vector_impl_data._M_finish;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_248._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_248._M_impl.super__Vector_impl_data._M_start = puVar8;
      local_248._M_impl.super__Vector_impl_data._M_finish = puVar9;
      local_248._M_impl.super__Vector_impl_data._M_end_of_storage = puVar3;
      local_1d8._M_impl.super__Vector_impl_data._M_start = paVar6;
      local_1d8._M_impl.super__Vector_impl_data._M_finish = paVar7;
      local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = paVar17;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_248);
      std::_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~_Vector_base
                (&local_1d8);
      return;
    }
    if (uVar11 == 0) {
      uVar11 = (ulong)(curmesh->mVertcnt).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[local_1e0];
      local_1e0 = local_1e0 + 1;
      if (uVar11 != 0) goto LAB_004dea0b;
LAB_004debab:
      uVar11 = 0;
    }
    else {
LAB_004dea0b:
      dVar4 = paVar17->x * 1518500249.0;
      uVar12 = (ulong)dVar4;
      dVar5 = paVar17->y * 1518500249.0;
      uVar13 = (ulong)dVar5;
      local_268._8_8_ = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13;
      local_268._0_8_ = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12;
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
      emplace_back<ClipperLib::IntPoint>(&subject,(IntPoint *)local_268);
      uVar11 = uVar11 - 1;
      if (uVar11 == 0) {
        bVar10 = ClipperLib::Orientation(&subject);
        if (!bVar10) {
          std::
          __reverse<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                    (subject.
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     subject.
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        ClipperLib::ClipperBase::AddPolygon
                  ((ClipperBase *)(clipper._vptr_Clipper[-3] + (long)&clipper),&subject,ptSubject);
        ClipperLib::ClipperBase::AddPolygon
                  ((ClipperBase *)(clipper._vptr_Clipper[-3] + (long)&clipper),&clip,ptClip);
        ClipperLib::Clipper::Execute(&clipper,ctIntersection,&clipped,pftNonZero,pftNonZero);
        local_1b0 = clipped.
                    super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        for (pEVar16 = clipped.
                       super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                       ._M_impl.super__Vector_impl_data._M_start; pEVar16 != local_1b0;
            pEVar16 = pEVar16 + 1) {
          local_268._0_4_ =
               (int)((ulong)((long)(pEVar16->outer).
                                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pEVar16->outer).
                                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
                     (uint *)local_268);
          pIVar2 = (pEVar16->outer).
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pIVar15 = (pEVar16->outer).
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_start; pIVar15 != pIVar2;
              pIVar15 = pIVar15 + 1) {
            auVar18._0_8_ = (double)pIVar15->X;
            auVar18._8_8_ = (double)pIVar15->Y;
            local_268 = divpd(auVar18,_DAT_005d18a0);
            local_258 = 0.0;
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            emplace_back<aiVector3t<double>>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_1d8,
                       (aiVector3t<double> *)local_268);
          }
        }
        if (subject.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            subject.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          subject.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               subject.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::clear(&clipped);
        ClipperLib::Clipper::Clear(&clipper);
        goto LAB_004debab;
      }
    }
    paVar17 = paVar17 + 1;
  } while( true );
}

Assistant:

void CleanupOuterContour(const std::vector<IfcVector2>& contour_flat, TempMesh& curmesh)
{
    std::vector<IfcVector3> vold;
    std::vector<unsigned int> iold;

    vold.reserve(curmesh.mVerts.size());
    iold.reserve(curmesh.mVertcnt.size());

    // Fix the outer contour using polyclipper
    try {

        ClipperLib::Polygon subject;
        ClipperLib::Clipper clipper;
        ClipperLib::ExPolygons clipped;

        ClipperLib::Polygon clip;
        clip.reserve(contour_flat.size());
        for(const IfcVector2& pip : contour_flat) {
            clip.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
        }

        if (!ClipperLib::Orientation(clip)) {
            std::reverse(clip.begin(), clip.end());
        }

        // We need to run polyclipper on every single polygon -- we can't run it one all
        // of them at once or it would merge them all together which would undo all
        // previous steps
        subject.reserve(4);
        size_t index = 0;
        size_t countdown = 0;
        for(const IfcVector3& pip : curmesh.mVerts) {
            if (!countdown) {
                countdown = curmesh.mVertcnt[index++];
                if (!countdown) {
                    continue;
                }
            }
            subject.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
            if (--countdown == 0) {
                if (!ClipperLib::Orientation(subject)) {
                    std::reverse(subject.begin(), subject.end());
                }

                clipper.AddPolygon(subject,ClipperLib::ptSubject);
                clipper.AddPolygon(clip,ClipperLib::ptClip);

                clipper.Execute(ClipperLib::ctIntersection,clipped,ClipperLib::pftNonZero,ClipperLib::pftNonZero);

                for(const ClipperLib::ExPolygon& ex : clipped) {
                    iold.push_back(static_cast<unsigned int>(ex.outer.size()));
                    for(const ClipperLib::IntPoint& point : ex.outer) {
                        vold.push_back(IfcVector3(
                            from_int64(point.X),
                            from_int64(point.Y),
                            0.0f));
                    }
                }

                subject.clear();
                clipped.clear();
                clipper.Clear();
            }
        }
    }
    catch (const char* sx) {
        IFCImporter::LogError("Ifc: error during polygon clipping, wall contour line may be wrong: (Clipper: "
            + std::string(sx) + ")");

        return;
    }

    // swap data arrays
    std::swap(vold,curmesh.mVerts);
    std::swap(iold,curmesh.mVertcnt);
}